

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

void iCopyPaletted<cBGRA,bCopyAlpha>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  BYTE a_00;
  bool bVar1;
  uint uVar2;
  int a;
  int v;
  int pos;
  int y;
  int x;
  int step_x_local;
  int Pitch_local;
  int srcheight_local;
  int srcwidth_local;
  BYTE *patch_local;
  BYTE *buffer_local;
  
  for (v = 0; v < srcheight; v = v + 1) {
    a = v * Pitch;
    for (pos = 0; pos < srcwidth; pos = pos + 1) {
      uVar2 = (uint)patch[v * step_y + pos * step_x];
      a_00 = palette[(int)uVar2].field_0.field_0.a;
      bVar1 = bCopyAlpha::ProcessAlpha0();
      if ((bVar1) || (a_00 != '\0')) {
        bCopyAlpha::OpC(buffer + (a + 2),palette[(int)uVar2].field_0.field_0.r,a_00,inf);
        bCopyAlpha::OpC(buffer + (a + 1),palette[(int)uVar2].field_0.field_0.g,a_00,inf);
        bCopyAlpha::OpC(buffer + a,palette[(int)uVar2].field_0.field_0.b,a_00,inf);
        bCopyAlpha::OpA(buffer + (a + 3),a_00,inf);
      }
      a = a + 4;
    }
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}